

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::anon_unknown_160::LoadAsset
               (AssetResolutionResolver *resolver,string *current_working_path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *search_paths,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
               *fileformats,AssetPath *assetPath,Path *primPath,Layer *dst_layer,
               PrimSpec **dst_primspec_root,bool error_when_no_prims_found,
               bool error_when_asset_not_found,bool error_when_unsupported_fileformat,string *warn,
               string *err)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  Asset *asset_out;
  Layer *layer_00;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *pcVar8;
  string *warn_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string _warn;
  string _err;
  string resolved_path;
  string ext;
  Asset asset;
  ostringstream ss_e_8;
  string base_dir;
  ostringstream ss_e_6;
  Layer layer;
  allocator local_1e89;
  PrimSpec *local_1e88;
  string local_1e80;
  string local_1e60;
  undefined1 local_1e40 [64];
  undefined1 local_1e00 [40];
  size_type local_1dd8;
  string local_1dc0;
  undefined1 local_1da0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d70;
  undefined8 local_1d60;
  storage_t<double> local_1d58;
  undefined1 local_1d50 [40];
  undefined1 local_1d28 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d18 [22];
  string local_1bb0;
  undefined1 local_1b90 [24];
  undefined1 local_1b78 [16];
  undefined1 local_1b68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b58;
  undefined8 local_1b48;
  undefined1 auStack_1b40 [1304];
  undefined1 local_1628 [48];
  storage_t<tinyusdz::Token> local_15f8 [19];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1398 [155];
  
  if (dst_layer == (Layer *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
    poVar2 = ::std::operator<<((ostream *)local_1628,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1628,
                               "[Internal error]. `dst_layer` output arg is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
    return false;
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fileformats;
  ::std::__cxx11::string::string((string *)&local_1e80,(string *)assetPath);
  GetExtension(&local_1dc0,&local_1e80);
  if (local_1e80._M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
    poVar2 = ::std::operator<<((ostream *)local_1628,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb4);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1628,
                               "TODO: No assetPath but Prim path(e.g. </xform>) in references.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
    bVar1 = false;
    goto LAB_001797f8;
  }
  if (current_working_path->_M_string_length != 0) {
    ::std::__cxx11::string::_M_assign((string *)&resolver->_current_working_path);
  }
  if ((search_paths->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (search_paths->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&resolver->_search_paths,search_paths);
  }
  AssetResolutionResolver::resolve((string *)(local_1e00 + 0x20),resolver,&local_1e80);
  if (local_1dd8 == 0) {
    if (error_when_asset_not_found) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      poVar2 = ::std::operator<<((ostream *)local_1628,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xca);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)local_1d28,"Failed to resolve asset path `{}`",(allocator *)local_1da0);
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)local_1d28,(string *)&local_1e80,pbVar7);
      poVar2 = ::std::operator<<((ostream *)local_1628,(string *)local_1b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      bVar1 = false;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      poVar2 = ::std::operator<<((ostream *)local_1628,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xcc);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)local_1d28,"Asset not found: `{}`",(allocator *)local_1da0);
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)local_1d28,(string *)&local_1e80,pbVar7);
      poVar2 = ::std::operator<<((ostream *)local_1628,(string *)local_1b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      poVar2 = ::std::operator<<((ostream *)local_1628,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdc);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)local_1d28,"  current working path: `{}`",(allocator *)local_1da0);
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)local_1d28,(string *)current_working_path,pbVar7);
      poVar2 = ::std::operator<<((ostream *)local_1628,(string *)local_1b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      poVar2 = ::std::operator<<((ostream *)local_1628,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xde);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)local_1d28,"  resolver.current_working_path: `{}`",
                 (allocator *)local_1da0);
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)local_1d28,(string *)&resolver->_current_working_path,
                 pbVar7);
      poVar2 = ::std::operator<<((ostream *)local_1628,(string *)local_1b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      poVar2 = ::std::operator<<((ostream *)local_1628,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdf);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)local_1d28,"  search_paths: `{}`",(allocator *)local_1da0);
      fmt::format<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_1b90,(fmt *)local_1d28,(string *)search_paths,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pbVar7);
      poVar2 = ::std::operator<<((ostream *)local_1628,(string *)local_1b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      poVar2 = ::std::operator<<((ostream *)local_1628,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe1);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)local_1d28,"  resolver.search_paths: `{}`",(allocator *)local_1da0);
      fmt::format<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_1b90,(fmt *)local_1d28,(string *)&resolver->_search_paths,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pbVar7);
      poVar2 = ::std::operator<<((ostream *)local_1628,(string *)local_1b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      *dst_primspec_root = (PrimSpec *)0x0;
      bVar1 = true;
    }
  }
  else {
    this = &resolver->_search_paths;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this,search_paths);
    io::GetBaseDir(&local_1bb0,(string *)(local_1e00 + 0x20));
    if ((pointer)local_1bb0._M_string_length != (pointer)0x0) {
      ::std::__cxx11::string::_M_assign((string *)&resolver->_current_working_path);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,&local_1bb0);
    }
    local_1da0._0_8_ = (long)local_1da0 + 0x10;
    local_1da0._8_8_ = 0;
    local_1da0[0x10] = '\0';
    local_1da0._32_8_ = &local_1d70;
    local_1da0._40_8_ = 0;
    local_1d70._M_local_buf[0] = '\0';
    local_1d60 = local_1d50;
    local_1d58 = (storage_t<double>)0x0;
    local_1d50[0] = '\0';
    local_1d50._16_8_ = (uint8_t *)0x0;
    local_1d50._24_8_ = (pointer)0x0;
    local_1d50._32_8_ = (pointer)0x0;
    asset_out = (Asset *)local_1da0;
    psVar6 = (string *)err;
    bVar1 = AssetResolutionResolver::open_asset
                      (resolver,(string *)(local_1e00 + 0x20),&local_1e80,asset_out,warn,err);
    if (bVar1) {
      bVar1 = IsUSDFileFormat(&local_1e80);
      if ((bVar1) || (bVar1 = IsMtlxFileFormat(&local_1e80), bVar1)) {
        bVar1 = IsUSDFileFormat(&local_1e80);
        if ((bVar1) || (bVar1 = IsMtlxFileFormat(&local_1e80), bVar1)) goto LAB_001790a7;
        if (error_when_unsupported_fileformat) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
          poVar2 = ::std::operator<<((ostream *)local_1628,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"LoadAsset");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x104);
          ::std::operator<<(poVar2," ");
          pcVar8 = "TODO: Unknown/unsupported asset file format: {}";
          goto LAB_001795e0;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
        poVar2 = ::std::operator<<((ostream *)local_1628,"[warn]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"LoadAsset");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x108);
        ::std::operator<<(poVar2," ");
        pcVar8 = "TODO: Unknown/unsupported asset file format. Skipped: {}";
      }
      else {
        sVar3 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                ::count(fileformats,&local_1dc0);
        if (sVar3 != 0) {
LAB_001790a7:
          Layer::Layer((Layer *)local_1628);
          local_1e40._0_8_ = local_1e40 + 0x10;
          local_1e40._8_8_ = 0;
          layer_00 = (Layer *)0x0;
          local_1e40[0x10] = '\0';
          local_1e00._0_8_ = local_1e00 + 0x10;
          local_1e00._8_8_ = 0;
          local_1e00[0x10] = '\0';
          bVar1 = IsUSDFileFormat(&local_1e80);
          if (bVar1) {
            local_1b58._8_8_ = (long)local_1b68 + 8;
            local_1b68._0_8_ = (pointer)0x0;
            local_1b58._M_allocated_capacity = 0;
            auStack_1b40._0_8_ = (pointer)0x0;
            local_1b90[0] = true;
            local_1b90._1_3_ = 0xffffff;
            local_1b90._4_4_ = (storage_t<tinyusdz::Interpolation>)0x4000;
            local_1b90[8] = true;
            local_1b90._9_3_ = 0;
            local_1b90._12_4_ = (storage_t<tinyusdz::Axis>)0x0;
            local_1b90._16_8_ = 0x80000000400;
            local_1b78._0_8_ = 0x400000800;
            local_1b78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_1b68._8_8_ = 0;
            auStack_1b40._8_8_ = (anon_struct_8_0_00000001_for___align)0x1;
            layer_00 = (Layer *)local_1628;
            warn_00 = (string *)local_1e40;
            psVar6 = (string *)local_1e00;
            local_1b48 = local_1b58._8_8_;
            bVar1 = LoadLayerFromMemory((uint8_t *)local_1d50._16_8_,
                                        local_1d50._24_8_ - local_1d50._16_8_,(string *)&local_1e80,
                                        layer_00,warn_00,psVar6,(USDLoadOptions *)local_1b90);
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                         *)local_1b68);
            if (!bVar1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
              poVar2 = ::std::operator<<((ostream *)local_1b90,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"LoadAsset");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x125);
              ::std::operator<<(poVar2," ");
              ::std::__cxx11::string::string
                        ((string *)&local_1e60,"Failed to open `{}` as Layer: {}",
                         (allocator *)(local_1e40 + 0x20));
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)local_1d28,(fmt *)&local_1e60,&local_1e80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         warn_00);
LAB_00179744:
              poVar2 = ::std::operator<<((ostream *)local_1b90,(string *)local_1d28);
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::string::_M_dispose();
LAB_00179766:
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::append((string *)err);
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b90);
              goto LAB_001797ab;
            }
LAB_00179197:
            if ((warn != (string *)0x0) && (local_1e40._8_8_ != 0)) {
              ::std::__cxx11::string::append((string *)warn);
            }
            if (local_15f8[0]._8_8_ == 0) {
              if (error_when_no_prims_found) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                poVar2 = ::std::operator<<((ostream *)local_1b90,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x15a);
                ::std::operator<<(poVar2," ");
                pcVar8 = "No prims in layer `{}`";
                goto LAB_0017971a;
              }
              if (dst_primspec_root != (PrimSpec **)0x0) {
                *dst_primspec_root = (PrimSpec *)0x0;
              }
            }
            else {
              local_1e88 = (PrimSpec *)0x0;
              if (dst_primspec_root != (PrimSpec **)0x0) {
                local_1d28._0_8_ = local_1d18;
                local_1d28._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_1d18[0]._M_local_buf[0] = '\0';
                if (primPath->_valid == true) {
                  ::std::__cxx11::string::_M_assign((string *)local_1d28);
                }
                else {
                  if (local_1398[0]._M_string_length == 0) {
                    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_15f8[0].data.__align + 8);
                  }
                  else {
                    pbVar7 = local_1398;
                  }
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b90,"/",pbVar7);
                  ::std::__cxx11::string::operator=((string *)local_1d28,(string *)local_1b90);
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::string::string
                          ((string *)&local_1e60,"",(allocator *)(local_1e40 + 0x20));
                Path::Path((Path *)local_1b90,(string *)local_1d28,&local_1e60);
                bVar1 = Layer::find_primspec_at
                                  ((Layer *)local_1628,(Path *)local_1b90,&local_1e88,err);
                Path::~Path((Path *)local_1b90);
                ::std::__cxx11::string::_M_dispose();
                if (bVar1) {
                  if (local_1e88 == (PrimSpec *)0x0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                    poVar2 = ::std::operator<<((ostream *)local_1b90,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x180);
                    ::std::operator<<(poVar2," ");
                    pcVar8 = "Internal error: PrimSpec pointer is nullptr.";
                  }
                  else {
                    bVar1 = PropagateAssetResolverState
                                      (0,local_1e88,&resolver->_current_working_path,this);
                    if (bVar1) {
                      *dst_primspec_root = local_1e88;
                      ::std::__cxx11::string::_M_dispose();
                      goto LAB_00179d4f;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                    poVar2 = ::std::operator<<((ostream *)local_1b90,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x187);
                    ::std::operator<<(poVar2," ");
                    pcVar8 = "Store AssetResolver state to each PrimSpec failed.\n";
                  }
                  poVar2 = ::std::operator<<((ostream *)local_1b90,pcVar8);
                  ::std::operator<<(poVar2,"\n");
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                  poVar2 = ::std::operator<<((ostream *)local_1b90,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x17c);
                  ::std::operator<<(poVar2," ");
                  ::std::__cxx11::string::string
                            ((string *)(local_1e40 + 0x20),
                             "Failed to find PrimSpec `{}` in layer `{}`(resolved path: `{}`)",
                             &local_1e89);
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            (&local_1e60,(fmt *)(local_1e40 + 0x20),(string *)local_1d28,&local_1e80
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_1e00 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar6);
                  poVar2 = ::std::operator<<((ostream *)local_1b90,(string *)&local_1e60);
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)err);
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b90);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001797ab;
              }
LAB_00179d4f:
              Layer::set_asset_resolution_state
                        ((Layer *)local_1628,&resolver->_current_working_path,this,
                         resolver->_userdata);
            }
            Layer::operator=(dst_layer,(Layer *)local_1628);
            bVar1 = true;
          }
          else {
            bVar1 = IsMtlxFileFormat(&local_1e80);
            if (bVar1) {
              bVar1 = ::std::operator!=(&primPath->_prim_part,"/MaterialX");
              if (bVar1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                poVar2 = ::std::operator<<((ostream *)local_1b90,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,299);
                ::std::operator<<(poVar2," ");
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1d28,"Prim path must be </MaterialX>, but got: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)primPath);
                poVar2 = ::std::operator<<((ostream *)local_1b90,(string *)local_1d28);
                ::std::operator<<(poVar2,"\n");
                goto LAB_00179766;
              }
              PrimSpec::PrimSpec((PrimSpec *)local_1b90);
              layer_00 = (Layer *)local_1e40;
              bVar1 = LoadMaterialXFromAsset
                                ((Asset *)local_1da0,&local_1e80,(PrimSpec *)local_1b90,
                                 (string *)layer_00,(string *)local_1e00);
              if (bVar1) {
                ::std::__cxx11::string::assign(local_1b68);
                ::std::__cxx11::string::string
                          ((string *)local_1d28,"MaterialX",(allocator *)&local_1e60);
                pmVar5 = ::std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)(local_1628 + 0x20),(key_type *)local_1d28);
                PrimSpec::operator=(pmVar5,(PrimSpec *)local_1b90);
                ::std::__cxx11::string::_M_dispose();
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d28);
                poVar2 = ::std::operator<<((ostream *)local_1d28,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x131);
                ::std::operator<<(poVar2," ");
                ::std::__cxx11::string::string
                          ((string *)(local_1e40 + 0x20),"Failed to open mtlx asset `{}`",
                           (allocator *)&local_1e88);
                fmt::format<std::__cxx11::string>
                          ((string *)&local_1e60,(fmt *)(local_1e40 + 0x20),(string *)&local_1e80,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           layer_00);
                poVar2 = ::std::operator<<((ostream *)local_1d28,(string *)&local_1e60);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)err);
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d28);
              }
              PrimSpec::~PrimSpec((PrimSpec *)local_1b90);
              if (bVar1) goto LAB_00179197;
            }
            else {
              sVar3 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                      ::count(fileformats,&local_1dc0);
              if (sVar3 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b90);
                poVar2 = ::std::operator<<((ostream *)local_1b90,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x14a);
                ::std::operator<<(poVar2," ");
                pcVar8 = "FileFormat handler not found for asset `{}`";
LAB_0017971a:
                ::std::__cxx11::string::string
                          ((string *)&local_1e60,pcVar8,(allocator *)(local_1e40 + 0x20));
                fmt::format<std::__cxx11::string>
                          ((string *)local_1d28,(fmt *)&local_1e60,(string *)&local_1e80,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           layer_00);
                goto LAB_00179744;
              }
              PrimSpec::PrimSpec((PrimSpec *)local_1b90);
              pmVar4 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                       ::at(fileformats,&local_1dc0);
              args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pmVar4->userdata;
              layer_00 = (Layer *)local_1e00;
              bVar1 = (*pmVar4->reader)((Asset *)local_1da0,(PrimSpec *)local_1b90,
                                        (string *)local_1e40,(string *)layer_00,args_1);
              if (bVar1) {
                if (local_1b68._8_8_ != 0) {
                  pmVar5 = ::std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)(local_1628 + 0x20),(key_type *)local_1b68);
                  PrimSpec::operator=(pmVar5,(PrimSpec *)local_1b90);
                  PrimSpec::~PrimSpec((PrimSpec *)local_1b90);
                  goto LAB_00179197;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d28);
                poVar2 = ::std::operator<<((ostream *)local_1d28,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x143);
                ::std::operator<<(poVar2," ");
                ::std::__cxx11::string::string
                          ((string *)(local_1e40 + 0x20),
                           "PrimSpec element_name is empty. asset `{}`",(allocator *)&local_1e88);
                fmt::format<std::__cxx11::string>
                          ((string *)&local_1e60,(fmt *)(local_1e40 + 0x20),(string *)&local_1e80,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           layer_00);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d28);
                poVar2 = ::std::operator<<((ostream *)local_1d28,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13e);
                ::std::operator<<(poVar2," ");
                ::std::__cxx11::string::string
                          ((string *)(local_1e40 + 0x20),"Failed to read asset `{}` error: {}",
                           (allocator *)&local_1e88);
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_1e60,(fmt *)(local_1e40 + 0x20),&local_1e80,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e00,args_1);
              }
              poVar2 = ::std::operator<<((ostream *)local_1d28,(string *)&local_1e60);
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::append((string *)err);
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d28);
              PrimSpec::~PrimSpec((PrimSpec *)local_1b90);
            }
LAB_001797ab:
            bVar1 = false;
          }
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          Layer::~Layer((Layer *)local_1628);
          goto LAB_001797d1;
        }
        if (error_when_unsupported_fileformat) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
          poVar2 = ::std::operator<<((ostream *)local_1628,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"LoadAsset");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x114);
          ::std::operator<<(poVar2," ");
          pcVar8 = "Unknown/unsupported asset file format: {}";
LAB_001795e0:
          ::std::__cxx11::string::string((string *)local_1d28,pcVar8,(allocator *)local_1e40);
          psVar6 = (string *)&local_1e80;
          goto LAB_00178a97;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
        poVar2 = ::std::operator<<((ostream *)local_1628,"[warn]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"LoadAsset");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x117);
        ::std::operator<<(poVar2," ");
        pcVar8 = "Unknown/unsupported asset file format. Skipped: {}";
      }
      ::std::__cxx11::string::string((string *)local_1d28,pcVar8,(allocator *)local_1e40);
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)local_1d28,(string *)&local_1e80,&asset_out->version_);
      poVar2 = ::std::operator<<((ostream *)local_1628,(string *)local_1b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      bVar1 = true;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1628);
      poVar2 = ::std::operator<<((ostream *)local_1628,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xf7);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)local_1d28,"Failed to open asset `{}`.",(allocator *)local_1e40);
      psVar6 = (string *)(local_1e00 + 0x20);
LAB_00178a97:
      fmt::format<std::__cxx11::string>
                ((string *)local_1b90,(fmt *)local_1d28,psVar6,&asset_out->version_);
      poVar2 = ::std::operator<<((ostream *)local_1628,(string *)local_1b90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1628);
      bVar1 = false;
    }
LAB_001797d1:
    Asset::~Asset((Asset *)local_1da0);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::string::_M_dispose();
LAB_001797f8:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool LoadAsset(AssetResolutionResolver &resolver,
               const std::string &current_working_path,
               const std::vector<std::string> &search_paths,
               const std::map<std::string, FileFormatHandler> &fileformats,
               const value::AssetPath &assetPath, const Path &primPath,
               Layer *dst_layer, const PrimSpec **dst_primspec_root,
               const bool error_when_no_prims_found,
               const bool error_when_asset_not_found,
               const bool error_when_unsupported_fileformat, std::string *warn,
               std::string *err) {
  if (!dst_layer) {
    PUSH_ERROR_AND_RETURN(
        "[Internal error]. `dst_layer` output arg is nullptr.");
  }

  std::string asset_path = assetPath.GetAssetPath();
  std::string ext = GetExtension(asset_path);

  if (asset_path.empty()) {
    PUSH_ERROR_AND_RETURN(
        "TODO: No assetPath but Prim path(e.g. </xform>) in references.");
  }

  // TODO: Use std::stack to manage AssetResolutionResolver state?
  if (current_working_path.size()) {
    resolver.set_current_working_path(current_working_path);
  }

  if (search_paths.size()) {
    resolver.set_search_paths(search_paths);
  }

  // resolve path
  // TODO: Store resolved path to Reference?
  std::string resolved_path = resolver.resolve(asset_path);

  DCOUT("Loading references: " << resolved_path
                               << ", asset_path: " << asset_path);

  if (resolved_path.empty()) {
    if (error_when_asset_not_found) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to resolve asset path `{}`", asset_path));
    } else {
      PUSH_WARN(fmt::format("Asset not found: `{}`", asset_path));
#if 0 // for debugging. print cwd.
#if defined(__linux__)
      char pathname[4096];
      memset(pathname, 0, 4096);
      char *pathname_p = getcwd(pathname, 4096);

      if (pathname_p == nullptr) {
        PUSH_ERROR_AND_RETURN(
            "Getting current working directory failed.");
      }

      PUSH_WARN(fmt::format("  cwd = {}", std::string(pathname_p)));
#endif
#endif
      PUSH_WARN(
          fmt::format("  current working path: `{}`", current_working_path));
      PUSH_WARN(fmt::format("  resolver.current_working_path: `{}`",
                            resolver.current_working_path()));
      PUSH_WARN(fmt::format("  search_paths: `{}`", search_paths));
      PUSH_WARN(fmt::format("  resolver.search_paths: `{}`",
                            resolver.search_paths()));
      (*dst_primspec_root) = nullptr;
      return true;
    }
  }

  resolver.set_search_paths(search_paths);

  // Use resolved asset_path's basedir for current working path.
  // Add resolved asset_path's basedir to search path.
  std::string base_dir = io::GetBaseDir(resolved_path);
  if (base_dir.size()) {
    DCOUT(fmt::format("Add `{}' to asset search path.", base_dir));

    resolver.set_current_working_path(base_dir);

    resolver.add_search_path(base_dir);
  }

  Asset asset;
  if (!resolver.open_asset(resolved_path, asset_path, &asset, warn, err)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to open asset `{}`.", resolved_path));
  }

  DCOUT("Opened resolved assst: " << resolved_path
                                  << ", asset_path: " << asset_path);

  if (IsBuiltinFileFormat(asset_path)) {
    if (IsUSDFileFormat(asset_path) || IsMtlxFileFormat(asset_path)) {
      // ok
    } else {
      // TODO: obj
      if (error_when_unsupported_fileformat) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "TODO: Unknown/unsupported asset file format: {}", asset_path));
      } else {
        PUSH_WARN(fmt::format(
            "TODO: Unknown/unsupported asset file format. Skipped: {}",
            asset_path));
        return true;
      }
    }
  } else {
    if (fileformats.count(ext)) {
      DCOUT("Fileformat handler found for: " + ext);

    } else {
      DCOUT("Unknown/unsupported fileformat: " + ext);
      if (error_when_unsupported_fileformat) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Unknown/unsupported asset file format: {}", asset_path));
      } else {
        PUSH_WARN(fmt::format(
            "Unknown/unsupported asset file format. Skipped: {}", asset_path));
        return true;
      }
    }
  }

  Layer layer;
  std::string _warn;
  std::string _err;

  if (IsUSDFileFormat(asset_path)) {
    if (!LoadLayerFromMemory(asset.data(), asset.size(), asset_path, &layer,
                             &_warn, &_err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to open `{}` as Layer: {}", asset_path, _err));
    }
  } else if (IsMtlxFileFormat(asset_path)) {
    // primPath must be '</MaterialX>'
    if (primPath.prim_part() != "/MaterialX") {
      PUSH_ERROR_AND_RETURN("Prim path must be </MaterialX>, but got: " +
                            primPath.prim_part());
    }

    PrimSpec ps;
    if (!LoadMaterialXFromAsset(asset, asset_path, ps, &_warn, &_err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to open mtlx asset `{}`", asset_path));
    }

    ps.name() = "MaterialX";
    layer.primspecs()["MaterialX"] = ps;

  } else {
    if (fileformats.count(ext)) {
      PrimSpec ps;
      const FileFormatHandler &handler = fileformats.at(ext);

      if (!handler.reader(asset, ps, &_warn, &_err, handler.userdata)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to read asset `{}` error: {}",
                                          asset_path, _err));
      }

      if (ps.name().empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "PrimSpec element_name is empty. asset `{}`", asset_path));
      }

      layer.primspecs()[ps.name()] = ps;
      DCOUT("Read asset from custom fileformat handler: " << ext);
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "FileFormat handler not found for asset `{}`", asset_path));
    }
  }

  DCOUT("layer = " << print_layer(layer, 0));

  // TODO: Recursively resolve `references`

  if (_warn.size()) {
    if (warn) {
      (*warn) += _warn;
    }
  }

  if (layer.primspecs().empty()) {
    if (error_when_no_prims_found) {
      PUSH_ERROR_AND_RETURN(fmt::format("No prims in layer `{}`", asset_path));
    }

    if (dst_primspec_root) {
      (*dst_primspec_root) = nullptr;
    }

    (*dst_layer) = std::move(layer);

    return true;
  }

  const PrimSpec *src_ps{nullptr};

  if (dst_primspec_root) {
    std::string default_prim;
    if (primPath.is_valid()) {
      default_prim = primPath.prim_part();
      DCOUT("primPath = " << default_prim);
    } else {
      // Use `defaultPrim` metadatum
      if (layer.metas().defaultPrim.valid()) {
        default_prim = "/" + layer.metas().defaultPrim.str();
        DCOUT("layer.meta.defaultPrim = " << default_prim);
      } else {
        // Use the first Prim in the layer.
        default_prim = "/" + layer.primspecs().begin()->first;
        DCOUT("layer.primspecs[0].name = " << default_prim);
      }
    }

    if (!layer.find_primspec_at(Path(default_prim, ""), &src_ps, err)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to find PrimSpec `{}` in layer `{}`(resolved path: `{}`)",
          default_prim, asset_path, resolved_path));
    }

    if (!src_ps) {
      PUSH_ERROR_AND_RETURN("Internal error: PrimSpec pointer is nullptr.");
    }

    if (!PropagateAssetResolverState(0, *const_cast<PrimSpec *>(src_ps),
                                     resolver.current_working_path(),
                                     resolver.search_paths())) {
      PUSH_ERROR_AND_RETURN(
          "Store AssetResolver state to each PrimSpec failed.\n");
    }

    (*dst_primspec_root) = src_ps;
  }

  // FIXME: This may be redundant, since assetresulution state is stored in
  // each PrimSpec.
  // TODO: Remove layer-level assetresulution state store?
  //
  // save assetresolution state for nested composition.
  layer.set_asset_resolution_state(resolver.current_working_path(),
                                   resolver.search_paths(),
                                   resolver.get_userdata());

  (*dst_layer) = std::move(layer);

  return true;
}